

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveAttachExpr(NameContext *pName,Expr *pExpr)

{
  char *in_RSI;
  Expr *in_RDI;
  int rc;
  NameContext *unaff_retaddr;
  undefined4 local_14;
  
  local_14 = 0;
  if (in_RSI != (char *)0x0) {
    if (*in_RSI == '<') {
      *in_RSI = 'v';
    }
    else {
      local_14 = sqlite3ResolveExprNames(unaff_retaddr,in_RDI);
    }
  }
  return local_14;
}

Assistant:

static int resolveAttachExpr(NameContext *pName, Expr *pExpr)
{
  int rc = SQLITE_OK;
  if( pExpr ){
    if( pExpr->op!=TK_ID ){
      rc = sqlite3ResolveExprNames(pName, pExpr);
    }else{
      pExpr->op = TK_STRING;
    }
  }
  return rc;
}